

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::project_metrics(Omega_h *this,Mesh *mesh,Reals *e2m)

{
  int *piVar1;
  LO nmetrics;
  Int IVar2;
  void *pvVar3;
  void *extraout_RDX;
  Alloc *pAVar4;
  Reals RVar5;
  Reals local_68;
  Reals local_58;
  Reals local_48;
  Reals local_38;
  
  nmetrics = Mesh::nelems(mesh);
  local_38.write_.shared_alloc_.alloc = (e2m->write_).shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.write_.shared_alloc_.alloc)->use_count =
           (local_38.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.write_.shared_alloc_.direct_ptr = (e2m->write_).shared_alloc_.direct_ptr;
  IVar2 = get_metrics_dim(nmetrics,&local_38);
  pAVar4 = local_38.write_.shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  if (IVar2 == 1) {
    local_68.write_.shared_alloc_.alloc = (e2m->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (e2m->write_).shared_alloc_.direct_ptr;
    RVar5 = project_metrics_dim<1>(this,mesh,&local_68);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_68.write_.shared_alloc_.alloc;
  }
  else if (IVar2 == 2) {
    local_58.write_.shared_alloc_.alloc = (e2m->write_).shared_alloc_.alloc;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.write_.shared_alloc_.alloc)->use_count =
             (local_58.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58.write_.shared_alloc_.direct_ptr = (e2m->write_).shared_alloc_.direct_ptr;
    RVar5 = project_metrics_dim<2>(this,mesh,&local_58);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_58.write_.shared_alloc_.alloc;
  }
  else {
    if (IVar2 != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
           ,0xfb);
    }
    local_48.write_.shared_alloc_.alloc = (e2m->write_).shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48.write_.shared_alloc_.alloc =
             (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_48.write_.shared_alloc_.alloc)->use_count =
             (local_48.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_48.write_.shared_alloc_.direct_ptr = (e2m->write_).shared_alloc_.direct_ptr;
    RVar5 = project_metrics_dim<3>(this,mesh,&local_48);
    pvVar3 = RVar5.write_.shared_alloc_.direct_ptr;
    pAVar4 = local_48.write_.shared_alloc_.alloc;
  }
  if (((ulong)pAVar4 & 7) == 0 && pAVar4 != (Alloc *)0x0) {
    piVar1 = &pAVar4->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar4);
      operator_delete(pAVar4,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals project_metrics(Mesh* mesh, Reals e2m) {
  auto metric_dim = get_metrics_dim(mesh->nelems(), e2m);
  if (metric_dim == 3)
    return project_metrics_dim<3>(mesh, e2m);
  else if (metric_dim == 2)
    return project_metrics_dim<2>(mesh, e2m);
  else if (metric_dim == 1)
    return project_metrics_dim<1>(mesh, e2m);
  else
    OMEGA_H_NORETURN(Reals());
}